

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_compileData *
MOJOSHADER_compile(char *srcprofile,char *filename,char *source,uint sourcelen,
                  MOJOSHADER_preprocessorDefine *defs,uint define_count,
                  MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close,
                  MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  size_t len;
  MOJOSHADER_astNodeType MVar1;
  int iVar2;
  MOJOSHADER_astNode *pMVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FILE *io;
  int iVar7;
  Context_conflict *ctx;
  MOJOSHADER_irStatement **__s;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_compileData *_data;
  MOJOSHADER_error *pMVar10;
  int i;
  MOJOSHADER_astNode **ppMVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  if (m == (MOJOSHADER_malloc)0x0 && f != (MOJOSHADER_free)0x0) {
    return &MOJOSHADER_out_of_mem_compile_data;
  }
  if (m != (MOJOSHADER_malloc)0x0 && f == (MOJOSHADER_free)0x0) {
    return &MOJOSHADER_out_of_mem_compile_data;
  }
  ctx = build_context(m,f,d);
  if (ctx == (Context_conflict *)0x0) {
    return &MOJOSHADER_out_of_mem_compile_data;
  }
  choose_src_profile(ctx,srcprofile);
  if (((ctx->isfail == 0) &&
      (parse_source(ctx,filename,source,sourcelen,defs,define_count,include_open,include_close),
      ctx->isfail == 0)) && (type_check_ast(ctx,ctx->ast), ctx->isfail == 0)) {
    len = (long)ctx->user_func_index * 8 + 8;
    __s = (MOJOSHADER_irStatement **)Malloc(ctx,len);
    ctx->ir = __s;
    if (__s != (MOJOSHADER_irStatement **)0x0) {
      memset(__s,0,len);
      ctx->ir_end = -1;
      ctx->ir_ret = -1;
      ppMVar11 = &ctx->ast;
      while (io = _stdout, pMVar3 = *ppMVar11, pMVar3 != (MOJOSHADER_astNode *)0x0) {
        MVar1 = (pMVar3->ast).type;
        if (MVar1 < MOJOSHADER_AST_COMPUNIT_FUNCTION) {
          __assert_fail("ast->ast.type > MOJOSHADER_AST_COMPUNIT_START_RANGE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x172d,"void intermediate_representation(Context *)");
        }
        if (MOJOSHADER_AST_COMPUNIT_VARIABLE < MVar1) {
          __assert_fail("ast->ast.type < MOJOSHADER_AST_COMPUNIT_END_RANGE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x172e,"void intermediate_representation(Context *)");
        }
        if ((MVar1 == MOJOSHADER_AST_COMPUNIT_FUNCTION) &&
           ((pMVar3->binary).right != (MOJOSHADER_astExpression *)0x0)) {
          if (ctx->ir_loop != (LoopLabels *)0x0) {
            __assert_fail("ctx->ir_loop == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1736,"void intermediate_representation(Context *)");
          }
          iVar7 = ctx->ir_label_count;
          ctx->ir_label_count = iVar7 + 2;
          ctx->ir_end = iVar7 + 1;
          if (((pMVar3->arguments).next)->argument != (MOJOSHADER_astExpression *)0x0) {
            iVar2 = ctx->ir_temp_count;
            ctx->ir_temp_count = iVar2 + 1;
            ctx->ir_ret = iVar2;
          }
          pMVar8 = new_ir_label(ctx,iVar7);
          pMVar9 = build_ir_stmt(ctx,(pMVar3->binary).right);
          pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
          pMVar9 = new_ir_label(ctx,iVar7 + 1);
          pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
          if (ctx->ir_loop != (LoopLabels *)0x0) {
            __assert_fail("ctx->ir_loop == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1742,"void intermediate_representation(Context *)");
          }
          ctx->ir_end = -1;
          ctx->ir_ret = -1;
          iVar7 = (pMVar3->derefstruct).isswizzle;
          if (ctx->user_func_index < iVar7) {
            __assert_fail("astfn->index <= ctx->user_func_index",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1746,"void intermediate_representation(Context *)");
          }
          if (ctx->ir[iVar7] != (MOJOSHADER_irStatement *)0x0) {
            __assert_fail("ctx->ir[astfn->index] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1747,"void intermediate_representation(Context *)");
          }
          ctx->ir[iVar7] = pMVar8;
        }
        ppMVar11 = (MOJOSHADER_astNode **)&(pMVar3->expression).datatype;
      }
      if (ctx->ir != (MOJOSHADER_irStatement **)0x0) {
        for (uVar12 = 0; (long)uVar12 <= (long)ctx->user_func_index; uVar12 = uVar12 + 1) {
          printf("[FUNCTION %d ]\n",uVar12 & 0xffffffff);
          print_ir(io,1,ctx->ir[uVar12]);
        }
      }
      delete_compilation_unit(ctx,&ctx->ast->compunit);
      ctx->ast = (MOJOSHADER_astNode *)0x0;
    }
  }
  _data = (MOJOSHADER_compileData *)Malloc(ctx,0x58);
  if (_data != (MOJOSHADER_compileData *)0x0) {
    _data->malloc = (MOJOSHADER_malloc)0x0;
    _data->free = (MOJOSHADER_free)0x0;
    _data->output_len = 0;
    _data->symbol_count = 0;
    _data->symbols = (MOJOSHADER_symbol *)0x0;
    _data->source_profile = (char *)0x0;
    _data->output = (char *)0x0;
    _data->malloc_data = (void *)0x0;
    *(undefined8 *)&_data->warning_count = 0;
    _data->warnings = (MOJOSHADER_error *)0x0;
    *(undefined8 *)_data = 0;
    _data->errors = (MOJOSHADER_error *)0x0;
    uVar4 = *(uint *)((long)&ctx->malloc + 4);
    uVar5 = *(uint *)&ctx->free;
    uVar6 = *(uint *)((long)&ctx->free + 4);
    uVar13 = -(uint)(*(uint *)&ctx->malloc == 0x11c9d4);
    uVar14 = -(uint)(uVar4 == 0);
    uVar15 = -(uint)(uVar5 == 0x11c9dc);
    uVar16 = -(uint)(uVar6 == 0);
    *(uint *)&_data->malloc = ~(uVar14 & uVar13) & *(uint *)&ctx->malloc;
    *(uint *)((long)&_data->malloc + 4) = ~(uVar13 & uVar14) & uVar4;
    *(uint *)&_data->free = ~(uVar16 & uVar15) & uVar5;
    *(uint *)((long)&_data->free + 4) = ~(uVar15 & uVar16) & uVar6;
    _data->malloc_data = ctx->malloc_data;
    _data->source_profile = ctx->source_profile;
    iVar7 = errorlist_count(ctx->errors);
    _data->error_count = iVar7;
    pMVar10 = errorlist_flatten(ctx->errors);
    _data->errors = pMVar10;
    iVar7 = errorlist_count(ctx->warnings);
    _data->warning_count = iVar7;
    pMVar10 = errorlist_flatten(ctx->warnings);
    _data->warnings = pMVar10;
    if (ctx->out_of_memory == 0) goto LAB_00121110;
    MOJOSHADER_freeCompileData(_data);
  }
  _data = &MOJOSHADER_out_of_mem_compile_data;
LAB_00121110:
  destroy_context(ctx);
  return _data;
}

Assistant:

const MOJOSHADER_compileData *MOJOSHADER_compile(const char *srcprofile,
                                    const char *filename, const char *source,
                                    unsigned int sourcelen,
                                    const MOJOSHADER_preprocessorDefine *defs,
                                    unsigned int define_count,
                                    MOJOSHADER_includeOpen include_open,
                                    MOJOSHADER_includeClose include_close,
                                    MOJOSHADER_malloc m, MOJOSHADER_free f,
                                    void *d)
{
    // !!! FIXME: cut and paste from MOJOSHADER_parseAst().
    MOJOSHADER_compileData *retval = NULL;
    Context *ctx = NULL;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_compile_data;  // supply both or neither.

    ctx = build_context(m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_compile_data;

    choose_src_profile(ctx, srcprofile);

    if (!isfail(ctx))
    {
        parse_source(ctx, filename, source, sourcelen, defs, define_count,
                     include_open, include_close);
    } // if

    if (!isfail(ctx))
        semantic_analysis(ctx);

    if (!isfail(ctx))
        intermediate_representation(ctx);

    if (isfail(ctx))
        retval = (MOJOSHADER_compileData *) build_failed_compile(ctx);
    else
        retval = (MOJOSHADER_compileData *) build_compiledata(ctx);

    destroy_context(ctx);
    return retval;
}